

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::BaseEmitter::commentv(BaseEmitter *this,char *fmt,__va_list_tag *ap)

{
  Error _err;
  Error EVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  StringTmp<1024UL> sb;
  
  if ((this->_emitterFlags & 8) == 0) {
    EVar1 = 0;
    if ((this->_emitterFlags & 1) == 0) {
      EVar1 = 5;
      reportError(this,5,(char *)0x0);
    }
  }
  else {
    sb.super_String.field_0._large.data = sb._embeddedData;
    sb.super_String.field_0._large.size = 0;
    sb.super_String.field_0._0_8_ = 0x20;
    sb.super_String.field_0._large.capacity = 0x407;
    sb._embeddedData[0] = '\0';
    EVar1 = String::appendVFormat(&sb.super_String,fmt,ap);
    if (EVar1 == 0) {
      uVar2 = sb.super_String.field_0._large.size;
      uVar3 = sb.super_String.field_0._large.data;
      if ((sb.super_String.field_0._0_8_ & 0xff) < 0x1f) {
        uVar2 = sb.super_String.field_0._0_8_ & 0xff;
        uVar3 = (char *)((long)&sb.super_String.field_0 + 1);
      }
      EVar1 = (*this->_vptr_BaseEmitter[0xf])(this,uVar3,uVar2);
    }
    String::reset(&sb.super_String);
  }
  return EVar1;
}

Assistant:

Error BaseEmitter::commentv(const char* fmt, va_list ap) {
  if (!hasEmitterFlag(kFlagLogComments)) {
    if (!hasEmitterFlag(kFlagAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;
  Error err = sb.appendVFormat(fmt, ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt, ap);
  return kErrorOk;
#endif
}